

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::RecordStrConstant
          (FunctionBody *this,RegSlot location,LPCOLESTR psz,uint32 cch,bool forcePropertyString)

{
  PropertyRecord *this_00;
  PropertyId propertyId;
  PropertyString *local_40;
  Var str;
  PropertyRecord *propertyRecord;
  ScriptContext *scriptContext;
  bool forcePropertyString_local;
  LPCOLESTR pOStack_20;
  uint32 cch_local;
  LPCOLESTR psz_local;
  FunctionBody *pFStack_10;
  RegSlot location_local;
  FunctionBody *this_local;
  
  scriptContext._3_1_ = forcePropertyString;
  scriptContext._4_4_ = cch;
  pOStack_20 = psz;
  psz_local._4_4_ = location;
  pFStack_10 = this;
  propertyRecord = (PropertyRecord *)FunctionProxy::GetScriptContext((FunctionProxy *)this);
  if ((scriptContext._3_1_ & 1) == 0) {
    ScriptContext::FindPropertyRecord
              ((ScriptContext *)propertyRecord,pOStack_20,scriptContext._4_4_,
               (PropertyRecord **)&str);
  }
  else {
    ScriptContext::GetOrAddPropertyRecord
              ((ScriptContext *)propertyRecord,pOStack_20,scriptContext._4_4_,
               (PropertyRecord **)&str);
  }
  this_00 = propertyRecord;
  if (str == (Var)0x0) {
    local_40 = (PropertyString *)
               JavascriptString::NewCopyBuffer
                         (pOStack_20,scriptContext._4_4_,(ScriptContext *)propertyRecord);
  }
  else {
    propertyId = PropertyRecord::GetPropertyId((PropertyRecord *)str);
    local_40 = ScriptContext::GetPropertyString((ScriptContext *)this_00,propertyId);
  }
  RecordConstant(this,psz_local._4_4_,local_40);
  return;
}

Assistant:

void FunctionBody::RecordStrConstant(RegSlot location, LPCOLESTR psz, uint32 cch, bool forcePropertyString)
    {
        ScriptContext *scriptContext = this->GetScriptContext();
        PropertyRecord const * propertyRecord;
        if (forcePropertyString)
        {
            scriptContext->GetOrAddPropertyRecord(psz, cch, &propertyRecord);
        }
        else
        {
            scriptContext->FindPropertyRecord(psz, cch, &propertyRecord);
        }
        Var str;
        if (propertyRecord == nullptr)
        {
            str = JavascriptString::NewCopyBuffer(psz, cch, scriptContext);
        }
        else
        {
            // If a particular string constant already has a propertyId, just create a property string for it
            // as it might be likely that it is used for a property lookup
            str = scriptContext->GetPropertyString(propertyRecord->GetPropertyId());
        }
        this->RecordConstant(location, str);
    }